

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_precompute_gauss_array(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  interest_point *piVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int col;
  ulong uVar13;
  int row;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  float *pfVar19;
  int iVar20;
  int iVar21;
  int scale;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [64];
  float fVar42;
  float fVar43;
  float ry;
  float rx;
  uint local_10c;
  float local_d8;
  float local_d4;
  ulong local_d0;
  ulong local_c8;
  integral_image *local_c0;
  long local_b8;
  float *local_b0;
  long local_a8;
  float *local_a0;
  ulong local_98;
  ulong local_90;
  int local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  ulong local_68;
  interest_point *local_60;
  ulong local_58;
  long local_50;
  undefined1 local_48 [16];
  
  auVar33._8_4_ = 0x80000000;
  auVar33._0_8_ = 0x8000000080000000;
  auVar33._12_4_ = 0x80000000;
  fVar34 = ipoint->scale;
  auVar35._8_4_ = 0x3effffff;
  auVar35._0_8_ = 0x3effffff3effffff;
  auVar35._12_4_ = 0x3effffff;
  local_48 = ZEXT416((uint)fVar34);
  auVar22 = vpternlogd_avx512vl(auVar35,local_48,auVar33,0xf8);
  auVar22 = ZEXT416((uint)(fVar34 + auVar22._0_4_));
  auVar22 = vroundss_avx(auVar22,auVar22,0xb);
  scale = (int)auVar22._0_4_;
  fVar43 = -0.08 / (fVar34 * fVar34);
  auVar22 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)ipoint->x),auVar33,0xf8);
  auVar22 = ZEXT416((uint)(ipoint->x + auVar22._0_4_));
  auVar22 = vroundss_avx(auVar22,auVar22,0xb);
  auVar23._0_8_ = (double)auVar22._0_4_;
  auVar23._8_8_ = auVar22._8_8_;
  auVar25._0_8_ = (double)fVar34;
  auVar25._8_8_ = 0;
  auVar22 = vfmadd231sd_fma(auVar23,auVar25,ZEXT816(0x3fe0000000000000));
  local_7c = (float)auVar22._0_8_;
  auVar22 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)ipoint->y),auVar33,0xf8);
  auVar22 = ZEXT416((uint)(ipoint->y + auVar22._0_4_));
  auVar22 = vroundss_avx(auVar22,auVar22,0xb);
  auVar24._0_8_ = (double)auVar22._0_4_;
  auVar24._8_8_ = auVar22._8_8_;
  auVar22 = vfmadd231sd_fma(auVar24,auVar25,ZEXT816(0x3fe0000000000000));
  local_80 = (float)auVar22._0_8_;
  auVar22 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 0.5)),auVar33,0xf8);
  auVar22 = ZEXT416((uint)(fVar34 * 0.5 + auVar22._0_4_));
  auVar22 = vroundss_avx(auVar22,auVar22,0xb);
  auVar23 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 1.5)),auVar33,0xf8);
  auVar23 = ZEXT416((uint)(fVar34 * 1.5 + auVar23._0_4_));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  auVar24 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 2.5)),auVar33,0xf8);
  auVar24 = ZEXT416((uint)(fVar34 * 2.5 + auVar24._0_4_));
  auVar24 = vroundss_avx(auVar24,auVar24,0xb);
  auVar25 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 3.5)),auVar33,0xf8);
  auVar25 = ZEXT416((uint)(fVar34 * 3.5 + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  auVar26 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 4.5)),auVar33,0xf8);
  auVar26 = ZEXT416((uint)(fVar34 * 4.5 + auVar26._0_4_));
  auVar26 = vroundss_avx(auVar26,auVar26,0xb);
  auVar27 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 5.5)),auVar33,0xf8);
  auVar27 = ZEXT416((uint)(auVar27._0_4_ + fVar34 * 5.5));
  auVar27 = vroundss_avx(auVar27,auVar27,0xb);
  auVar41 = ZEXT1664(auVar27);
  auVar28 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 6.5)),auVar33,0xf8);
  auVar28 = ZEXT416((uint)(fVar34 * 6.5 + auVar28._0_4_));
  auVar28 = vroundss_avx(auVar28,auVar28,0xb);
  auVar29 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 7.5)),auVar33,0xf8);
  auVar29 = ZEXT416((uint)(fVar34 * 7.5 + auVar29._0_4_));
  auVar29 = vroundss_avx(auVar29,auVar29,0xb);
  auVar30 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 8.5)),auVar33,0xf8);
  auVar30 = ZEXT416((uint)(fVar34 * 8.5 + auVar30._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  auVar31 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 9.5)),auVar33,0xf8);
  auVar31 = ZEXT416((uint)(fVar34 * 9.5 + auVar31._0_4_));
  auVar31 = vroundss_avx(auVar31,auVar31,0xb);
  auVar32 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 10.5)),auVar33,0xf8);
  auVar32 = ZEXT416((uint)(fVar34 * 10.5 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar33 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)(fVar34 * 11.5)),auVar33,0xf8);
  auVar33 = ZEXT416((uint)(fVar34 * 11.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  fVar37 = auVar24._0_4_;
  fVar34 = fVar37 + auVar23._0_4_;
  local_b8 = CONCAT44(local_b8._4_4_,fVar37 + auVar22._0_4_);
  fVar2 = fVar37 - auVar22._0_4_;
  local_b0 = (float *)CONCAT44(local_b0._4_4_,fVar37 - auVar23._0_4_);
  local_a8 = CONCAT44(local_a8._4_4_,fVar37 - auVar25._0_4_);
  local_a0 = (float *)CONCAT44(local_a0._4_4_,fVar37 - auVar26._0_4_);
  fVar40 = fVar37 - auVar27._0_4_;
  local_98 = CONCAT44(local_98._4_4_,fVar37 - auVar28._0_4_);
  fVar42 = auVar29._0_4_;
  local_90 = CONCAT44(local_90._4_4_,fVar42 - auVar25._0_4_);
  fVar37 = fVar42 - auVar26._0_4_;
  fVar3 = fVar42 - auVar27._0_4_;
  fVar4 = fVar42 - auVar28._0_4_;
  local_c8 = CONCAT44(local_c8._4_4_,fVar42 - auVar30._0_4_);
  local_d0 = CONCAT44(local_d0._4_4_,fVar42 - auVar31._0_4_);
  fVar5 = fVar42 - auVar32._0_4_;
  local_78._0_4_ = fVar42 - auVar33._0_4_;
  local_c0 = iimage;
  gauss_s1_c0[0] = expf(fVar43 * fVar34 * fVar34);
  gauss_s1_c0[1] = expf((float)local_b8 * (float)local_b8 * fVar43);
  gauss_s1_c0[2] = expf(fVar2 * fVar2 * fVar43);
  gauss_s1_c0[3] = expf(local_b0._0_4_ * local_b0._0_4_ * fVar43);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf((float)local_a8 * (float)local_a8 * fVar43);
  gauss_s1_c0[6] = expf(local_a0._0_4_ * local_a0._0_4_ * fVar43);
  gauss_s1_c0[7] = expf(fVar40 * fVar40 * fVar43);
  gauss_s1_c0[8] = expf((float)local_98 * (float)local_98 * fVar43);
  gauss_s1_c1[0] = expf((float)local_90 * (float)local_90 * fVar43);
  gauss_s1_c1[1] = expf(fVar37 * fVar37 * fVar43);
  gauss_s1_c1[2] = expf(fVar3 * fVar3 * fVar43);
  gauss_s1_c1[3] = expf(fVar4 * fVar4 * fVar43);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf((float)local_c8 * (float)local_c8 * fVar43);
  gauss_s1_c1[6] = expf((float)local_d0 * (float)local_d0 * fVar43);
  gauss_s1_c1[7] = expf(fVar5 * fVar5 * fVar43);
  gauss_s1_c1[8] = expf((float)local_78._0_4_ * (float)local_78._0_4_ * fVar43);
  local_c8 = (ulong)(uint)(scale * 2);
  uVar13 = 0xfffffff8;
  fVar34 = 0.0;
  local_d0 = 0;
  lVar15 = 0;
  lVar17 = 0;
  local_60 = ipoint;
  do {
    uVar12 = (uint)uVar13;
    pfVar19 = gauss_s1_c0;
    if (uVar12 == 7) {
      pfVar19 = gauss_s1_c1;
    }
    if (uVar12 == 0xfffffff8) {
      pfVar19 = gauss_s1_c1;
    }
    lVar15 = (long)(int)lVar15;
    local_84 = (int)lVar17;
    lVar17 = (long)local_84;
    local_84 = local_84 + 4;
    local_b0 = (float *)((long)pfVar19 + (ulong)(uint)((int)(uVar13 >> 0x1f) << 5));
    local_10c = 9;
    uVar11 = 0xfffffff8;
    local_68 = uVar13;
    do {
      iVar10 = (int)uVar11;
      uVar13 = (ulong)((uint)(uVar11 >> 0x1c) & 8);
      local_a0 = gauss_s1_c0;
      if (iVar10 == 7) {
        local_a0 = gauss_s1_c1;
      }
      if (iVar10 == -8) {
        local_a0 = gauss_s1_c1;
      }
      local_a8 = (ulong)(-1 < iVar10) * 2 + -1;
      uVar8 = iVar10 + 8;
      auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
      local_b8 = lVar15;
      local_58 = uVar11;
      local_50 = lVar17;
      do {
        local_98 = (ulong)uVar8;
        auVar22._0_4_ = (float)(int)(uVar8 - 0xc);
        auVar22._4_12_ = auVar41._4_12_;
        auVar22 = vfmadd132ss_fma(auVar22,ZEXT416((uint)local_80),ZEXT416((uint)local_48._0_4_));
        auVar27._8_4_ = 0x3effffff;
        auVar27._0_8_ = 0x3effffff3effffff;
        auVar27._12_4_ = 0x3effffff;
        auVar26._8_4_ = 0x80000000;
        auVar26._0_8_ = 0x8000000080000000;
        auVar26._12_4_ = 0x80000000;
        auVar23 = vpternlogd_avx512vl(auVar27,auVar22,auVar26,0xf8);
        auVar22 = ZEXT416((uint)(auVar22._0_4_ + auVar23._0_4_));
        auVar22 = vroundss_avx(auVar22,auVar22,0xb);
        row = (int)auVar22._0_4_ - scale;
        fVar2 = local_a0[uVar13];
        iVar10 = (int)local_c8;
        iVar21 = -0xc;
        pfVar19 = local_b0;
        local_90 = uVar13;
        do {
          auVar29._0_4_ = (float)((int)local_d0 + iVar21);
          auVar29._4_12_ = auVar41._4_12_;
          auVar23 = vfmadd132ss_fma(auVar29,ZEXT416((uint)local_7c),ZEXT416((uint)local_48._0_4_));
          auVar30._8_4_ = 0x3effffff;
          auVar30._0_8_ = 0x3effffff3effffff;
          auVar30._12_4_ = 0x3effffff;
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar24 = vpternlogd_avx512vl(auVar30,auVar23,auVar28,0xf8);
          auVar23 = ZEXT416((uint)(auVar23._0_4_ + auVar24._0_4_));
          auVar23 = vroundss_avx(auVar23,auVar23,0xb);
          iVar9 = (int)auVar23._0_4_;
          col = iVar9 - scale;
          fVar40 = fVar2 * *pfVar19;
          local_d4 = 0.0;
          local_d8 = 0.0;
          if ((((row < 1) || (col < 1)) || (local_c0->height < row + iVar10)) ||
             (iVar14 = col + (int)local_c8, local_c0->width < iVar14)) {
            local_78 = ZEXT416((uint)fVar40);
            haarXY(local_c0,row,col,scale,&local_d4,&local_d8);
            fVar40 = (float)local_78._0_4_;
          }
          else {
            pfVar1 = local_c0->data;
            iVar16 = local_c0->data_width;
            iVar18 = iVar16 * (row + -1);
            iVar20 = iVar16 * ((int)auVar22._0_4_ + -1);
            iVar16 = iVar16 * (row + -1 + iVar10);
            auVar23 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar18 + -1 + iVar9] -
                                                    pfVar1[iVar16 + -1 + iVar9])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar16 + -1 + iVar14] -
                                                    pfVar1[iVar18 + -1 + col])));
            local_d4 = (pfVar1[iVar16 + -1 + col] - pfVar1[iVar18 + -1 + iVar14]) + auVar23._0_4_;
            auVar23 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar20 + -1 + col] -
                                                    pfVar1[iVar20 + -1 + iVar14])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar16 + -1 + iVar14] -
                                                    pfVar1[iVar18 + -1 + col])));
            local_d8 = auVar23._0_4_ - (pfVar1[iVar16 + -1 + col] - pfVar1[iVar18 + -1 + iVar14]);
          }
          piVar7 = local_60;
          auVar23 = vinsertps_avx(ZEXT416((uint)local_d8),ZEXT416((uint)local_d4),0x10);
          auVar32._0_4_ = fVar40 * auVar23._0_4_;
          auVar32._4_4_ = fVar40 * auVar23._4_4_;
          auVar32._8_4_ = fVar40 * auVar23._8_4_;
          auVar32._12_4_ = fVar40 * auVar23._12_4_;
          auVar31._8_4_ = 0x7fffffff;
          auVar31._0_8_ = 0x7fffffff7fffffff;
          auVar31._12_4_ = 0x7fffffff;
          auVar23 = vandps_avx512vl(auVar32,auVar31);
          auVar23 = vmovlhps_avx(auVar32,auVar23);
          auVar38._0_4_ = auVar39._0_4_ + auVar23._0_4_;
          auVar38._4_4_ = auVar39._4_4_ + auVar23._4_4_;
          auVar38._8_4_ = auVar39._8_4_ + auVar23._8_4_;
          auVar38._12_4_ = auVar39._12_4_ + auVar23._12_4_;
          auVar39 = ZEXT1664(auVar38);
          pfVar19 = pfVar19 + (ulong)(~uVar12 >> 0x1f) * 2 + -1;
          iVar21 = iVar21 + 1;
        } while (iVar21 != -3);
        uVar8 = (int)local_98 + 1;
        uVar13 = local_90 + local_a8;
      } while (uVar8 != local_10c);
      fVar2 = gauss_s2_arr[local_50];
      auVar6._4_4_ = fVar2;
      auVar6._0_4_ = fVar2;
      auVar6._8_4_ = fVar2;
      auVar6._12_4_ = fVar2;
      auVar24 = vmulps_avx512vl(auVar38,auVar6);
      lVar17 = local_50 + 1;
      *(undefined1 (*) [16])(local_60->descriptor + local_b8) = auVar24;
      auVar36._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar36._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar36._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar36._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar22 = vmovshdup_avx(auVar36);
      auVar23 = vfmadd231ss_fma(auVar22,auVar24,auVar24);
      auVar22 = vshufpd_avx(auVar24,auVar24,1);
      auVar23 = vfmadd213ss_fma(auVar22,auVar22,auVar23);
      auVar22 = vshufps_avx(auVar24,auVar24,0xff);
      auVar22 = vfmadd213ss_fma(auVar22,auVar22,auVar23);
      fVar34 = fVar34 + auVar22._0_4_;
      lVar15 = local_b8 + 4;
      uVar11 = (ulong)((int)local_58 + 5);
      local_10c = local_10c + 5;
    } while (local_84 != (int)lVar17);
    local_d0 = (ulong)((int)local_d0 + 5);
    uVar13 = (ulong)((int)local_68 + 5);
  } while ((int)local_68 < 3);
  if (fVar34 < 0.0) {
    fVar34 = sqrtf(fVar34);
  }
  else {
    auVar22 = vsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
    fVar34 = auVar22._0_4_;
  }
  auVar41 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar34)));
  lVar15 = 0;
  do {
    auVar39 = vmulps_avx512f(auVar41,*(undefined1 (*) [64])(piVar7->descriptor + lVar15));
    *(undefined1 (*) [64])(piVar7->descriptor + lVar15) = auVar39;
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_precompute_gauss_array(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - equal to get_msurf_descriptor_gauss_compute_once_case but with arrays insteat of case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point

    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8); l < (j + 17); ++l, gauss_index_l+=gauss_index_l_inc) {

                int sample_y = (int) roundf(ipoint_y + (l-12) * scale);
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {

                    int sample_x = (int) roundf(ipoint_x + (k-12) * scale);
                    int sample_x_sub_int_scale = sample_x-int_scale;
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    /* Code pre optimization
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}